

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

char * __thiscall GenericModel::index(GenericModel *this,char *__s,int __c)

{
  GenericModelItem *pGVar1;
  uint in_ECX;
  QModelIndex *in_R8;
  
  if (((-1 < (int)(in_ECX | __c)) &&
      (pGVar1 = GenericModelPrivate::itemForIndex(*(GenericModelPrivate **)(__s + 0x10),in_R8),
      __c < pGVar1->m_rowCount)) && ((int)in_ECX < pGVar1->m_colCount)) {
    pGVar1 = (pGVar1->children).d.ptr[(int)(pGVar1->m_colCount * __c + in_ECX)];
    *(int *)this = __c;
    *(uint *)&this->field_0x4 = in_ECX;
    *(GenericModelItem **)&this->field_0x8 = pGVar1;
    this->m_dptr = (GenericModelPrivate *)__s;
    return (char *)this;
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->m_dptr = (GenericModelPrivate *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex GenericModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (row < 0 || column < 0)
        return QModelIndex();
    Q_D(const GenericModel);
    GenericModelItem *parentItem = d->itemForIndex(parent);
    if (row >= parentItem->rowCount() || column >= parentItem->columnCount())
        return QModelIndex();
    return createIndex(row, column, parentItem->childAt(row, column));
}